

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O0

size_t gpu::deviceTypeSize<double>(void)

{
  Type TVar1;
  gpu_exception *this;
  undefined1 local_20 [8];
  Context context;
  
  Context::Context((Context *)local_20);
  TVar1 = Context::type((Context *)local_20);
  if (TVar1 == TypeOpenCL) {
    Context::~Context((Context *)local_20);
    return 8;
  }
  this = (gpu_exception *)__cxa_allocate_exception(0x10);
  gpu_exception::gpu_exception(this,"No GPU active context!");
  __cxa_throw(this,&gpu_exception::typeinfo,gpu_exception::~gpu_exception);
}

Assistant:

size_t gpu::deviceTypeSize() {
	Context context;
#ifdef CUDA_SUPPORT
	if (context.type() == Context::TypeCUDA) {
		return sizeof(T);
	} else
#endif
	if (context.type() == Context::TypeOpenCL) {
		return sizeof(typename ocl::OpenCLType<T>::type);
	} else {
		throw gpu_exception("No GPU active context!");
	}
}